

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang)

{
  cmMakefile *this_00;
  char *pcVar1;
  ulong uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  string local_150;
  undefined1 local_130 [8];
  string arg;
  string local_108 [8];
  string name;
  undefined1 local_e0 [8];
  string includeFlags;
  string local_b8;
  string local_98;
  string *local_78;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  bool useResponseFile;
  allocator local_41;
  undefined1 local_40 [8];
  string responseVar;
  string *lang_local;
  string *flags_local;
  cmMakefileTargetGenerator *this_local;
  
  responseVar.field_2._8_8_ = lang;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"CMAKE_",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::operator+=((string *)local_40,(string *)responseVar.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)local_40,"_USE_RESPONSE_FILE_FOR_INCLUDES");
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
       cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,(string *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"CMAKE_BUILD_TYPE",
             (allocator *)(includeFlags.field_2._M_local_buf + 0xf));
  pcVar1 = cmMakefile::GetSafeDefinition(this_00,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,pcVar1,(allocator *)(includeFlags.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(includeFlags.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(includeFlags.field_2._M_local_buf + 0xf));
  local_78 = &local_98;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (string *)responseVar.field_2._8_8_,local_78,true);
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_e0,(cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (string *)responseVar.field_2._8_8_,false,
             (bool)(includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1),local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    if ((includes.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,local_e0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_108,"includes_",(allocator *)(arg.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(arg.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=(local_108,(string *)responseVar.field_2._8_8_);
      std::__cxx11::string::operator+=(local_108,".rsp");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      makefile_depends =
           &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
            ::operator[](&this->FlagFileDepends,(key_type *)responseVar.field_2._8_8_)->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      CreateResponseFile(&local_150,this,pcVar1,(string *)local_e0,makefile_depends);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     "@",&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,local_130);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string(local_108);
    }
    name.field_2._12_4_ = 0;
  }
  else {
    name.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang)
{
  std::string responseVar = "CMAKE_";
  responseVar += lang;
  responseVar += "_USE_RESPONSE_FILE_FOR_INCLUDES";
  bool useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);

  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, false, useResponseFile, config);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string name = "includes_";
    name += lang;
    name += ".rsp";
    std::string arg = "@" +
      this->CreateResponseFile(name.c_str(), includeFlags,
                               this->FlagFileDepends[lang]);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}